

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-sell.c
# Opt level: O0

_Bool borg_has_mutiple(borg_item_conflict *in_item)

{
  uint uVar1;
  borg_item_conflict *pbVar2;
  borg_item_conflict *item_1;
  borg_item_conflict *item;
  int i;
  borg_item_conflict *in_item_local;
  
  if (in_item->iqty < 2) {
    if (((in_item->ident & 1U) == 0) &&
       ((uVar1 = (uint)in_item->tval, uVar1 - 2 < 0xd || (uVar1 == 0x10 || uVar1 == 0x11)))) {
      in_item_local._7_1_ = false;
    }
    else {
      for (item._4_4_ = 0; (int)item._4_4_ < (int)(uint)z_info->pack_size;
          item._4_4_ = item._4_4_ + 1) {
        pbVar2 = borg_items + (int)item._4_4_;
        if ((((pbVar2 != in_item) && (pbVar2->tval == in_item->tval)) &&
            (pbVar2->sval == in_item->sval)) && (pbVar2->iqty != '\0')) {
          return true;
        }
      }
      for (item._4_4_ = (uint)z_info->pack_size; (int)item._4_4_ < (int)(z_info->pack_size + 0xc);
          item._4_4_ = item._4_4_ + 1) {
        if (((borg_items[(int)item._4_4_].tval == in_item->tval) &&
            (borg_items[(int)item._4_4_].sval == in_item->sval)) &&
           (borg_items[(int)item._4_4_].iqty != '\0')) {
          return true;
        }
      }
      in_item_local._7_1_ = false;
    }
  }
  else {
    in_item_local._7_1_ = true;
  }
  return in_item_local._7_1_;
}

Assistant:

static bool borg_has_mutiple(borg_item *in_item)
{
    int i;
    if (in_item->iqty > 1)
        return true;

    /* Some types of items we only want to count as a dupe in a stack */
    /* for example two unIDd swords may look the same (both rapiers) */
    /* but have different powers */
    if (!in_item->ident) {
        switch (in_item->tval) {
        case TV_BOOTS:
        case TV_GLOVES:
        case TV_HELM:
        case TV_CROWN:
        case TV_SHIELD:
        case TV_SOFT_ARMOR:
        case TV_HARD_ARMOR:
        case TV_SHOT:
        case TV_BOLT:
        case TV_ARROW:
        case TV_BOW:
        case TV_DIGGING:
        case TV_HAFTED:
        case TV_POLEARM:
        case TV_SWORD:
           return false;
        }
    }

    /* check the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item *item = &borg_items[i];
        if (item == in_item)
            continue;
        if (item->tval == in_item->tval 
            && item->sval == in_item->sval
            && item->iqty != 0)
            return true;
    }

    /* check equipment */
    for (i = INVEN_WIELD; i < INVEN_TOTAL; i++) {
        borg_item *item = &borg_items[i];
        if (item->tval == in_item->tval
            && item->sval == in_item->sval
            && item->iqty != 0)
            return true;
    }
    return false;
}